

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::minF32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *this_00;
  undefined1 local_100 [8];
  LaneArray<4> other_lanes;
  LaneArray<4> lanes;
  
  getLanesF32x4((LaneArray<4> *)&other_lanes._M_elems[3].type,this);
  getLanesF32x4((LaneArray<4> *)local_100,other);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[3].type;
  do {
    this_00 = (Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1);
    min((Literal *)__return_storage_ptr___00,this_00,(Literal *)(local_100 + lVar1));
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)&other_lanes._M_elems[3].type);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_100 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::minF32x4(const Literal& other) const {
  return binary<4, &Literal::getLanesF32x4, &Literal::min>(*this, other);
}